

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

void __thiscall OpenMD::MoleculeStamp::checkFragments(MoleculeStamp *this)

{
  __normal_iterator<OpenMD::FragmentStamp_**,_std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>_>
  _Var1;
  ostream *poVar2;
  OpenMDException *this_00;
  string sStack_1b8;
  ostringstream oss;
  
  _oss = 0;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::FragmentStamp**,std::vector<OpenMD::FragmentStamp*,std::allocator<OpenMD::FragmentStamp*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::FragmentStamp*const>>
                    ((this->fragmentStamps_).
                     super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->fragmentStamps_).
                     super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->fragmentStamps_).
      super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Error in Molecule ");
  std::__cxx11::string::string((string *)&sStack_1b8,(string *)&(this->Name).data_);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_1b8);
  poVar2 = std::operator<<(poVar2,":fragment[");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::operator<<(poVar2,"] is missing\n");
  std::__cxx11::string::~string((string *)&sStack_1b8);
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,&sStack_1b8);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void MoleculeStamp::checkFragments() {
    std::vector<FragmentStamp*>::iterator fi =
        std::find(fragmentStamps_.begin(), fragmentStamps_.end(),
                  static_cast<FragmentStamp*>(NULL));
    if (fi != fragmentStamps_.end()) {
      std::ostringstream oss;
      oss << "Error in Molecule " << getName() << ":fragment["
          << fi - fragmentStamps_.begin() << "] is missing\n";
      throw OpenMDException(oss.str());
    }
  }